

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O0

V3f Imf_3_4::LatLongMap::direction(Box2i *dataWindow,V2f *pixelPosition)

{
  Box2i *in_RDI;
  float a;
  float b;
  double dVar1;
  double dVar2;
  undefined8 extraout_XMM0_Qa;
  V3f VVar3;
  V2f ll;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_20;
  undefined4 local_1c;
  
  latLong(in_RDI,(V2f *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  dVar1 = std::sin((double)(ulong)local_1c);
  dVar2 = std::cos((double)(ulong)local_20);
  a = SUB84(dVar1,0) * SUB84(dVar2,0);
  dVar1 = std::sin((double)(ulong)local_20);
  b = SUB84(dVar1,0);
  dVar1 = std::cos((double)(ulong)local_1c);
  dVar2 = std::cos((double)(ulong)local_20);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)in_RDI,a,b,SUB84(dVar1,0) * SUB84(dVar2,0));
  VVar3.z = b;
  VVar3.x = (float)(int)extraout_XMM0_Qa;
  VVar3.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar3;
}

Assistant:

V3f
direction (const Box2i& dataWindow, const V2f& pixelPosition)
{
    V2f ll = latLong (dataWindow, pixelPosition);

    return V3f (sin (ll.y) * cos (ll.x), sin (ll.x), cos (ll.y) * cos (ll.x));
}